

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O2

piga_status piga_client_connect(piga_client *client,char *name,int name_length)

{
  int __shmid;
  undefined8 in_RAX;
  void *pvVar1;
  piga_event_queue *ppVar2;
  piga_status status;
  
  status = (piga_status)((ulong)in_RAX >> 0x20);
  __shmid = shmget(client->config->shared_memory_key,
                   (long)client->config->player_count * 0x138 + 0x78,0x1b6);
  client->shared_memory_id = __shmid;
  if (__shmid == -1) {
    status = PIGA_ERROR_COULD_NOT_OPEN_SHARED_MEMORY;
  }
  else {
    pvVar1 = shmat(__shmid,(void *)0x0,0);
    (client->shared_memory).start = pvVar1;
    if (pvVar1 == (void *)0xffffffffffffffff) {
      status = PIGA_ERROR_COULD_NOT_ATTACH_SHARED_MEMORY;
    }
    else {
      piga_shared_memory_map(&client->shared_memory,pvVar1,(int)client->config->player_count);
      ppVar2 = (piga_event_queue *)
               piga_event_queue_connect_to_shm(0x1b62,&client->out_queue_shm_id,&status);
      client->out_queue = ppVar2;
      if (status == PIGA_STATUS_OK) {
        ppVar2 = (piga_event_queue *)
                 piga_event_queue_create_default_in_shm
                           (&client->in_queue_shm_id,&status,ppVar2,name,name_length);
        client->in_queue = ppVar2;
        piga_event_queue_set_type_mask(ppVar2,client->config->event_type_mask);
      }
    }
  }
  return status;
}

Assistant:

piga_status piga_client_connect(piga_client* client, const char *name, int name_length)
{
    int shared_memory_size = 
        client->config->player_count * sizeof(piga_player)
        + 120; // Padding
        
    client->shared_memory_id = shmget(client->config->shared_memory_key, 
        shared_memory_size, 0666);
    if(client->shared_memory_id == -1)
        return PIGA_ERROR_COULD_NOT_OPEN_SHARED_MEMORY;
    
    // Mapping the start segment
    client->shared_memory.start = shmat(client->shared_memory_id, 0, 0);
    if(client->shared_memory.start == (void*) -1)
        return PIGA_ERROR_COULD_NOT_ATTACH_SHARED_MEMORY;
    
    piga_shared_memory_map(&client->shared_memory, client->shared_memory.start, client->config->player_count);
    
    // Attach to the host-queue (out-queue).
    piga_status status;
    client->out_queue = piga_event_queue_connect_to_shm(
        PIGA_EVENT_QUEUE_START_KEY, 
        &client->out_queue_shm_id, 
        &status
    );
    
    if(status != PIGA_STATUS_OK)
        return status;
    
    // Create the in-queue. 
    client->in_queue = piga_event_queue_create_default_in_shm(
        &client->in_queue_shm_id,
        &status,
        client->out_queue,
        name, name_length
    );
    
    piga_event_queue_set_type_mask(client->in_queue, client->config->event_type_mask);
    
    if(status != PIGA_STATUS_OK)
        return status;
    
    return PIGA_STATUS_OK;
}